

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_utils.cc
# Opt level: O1

void draco::ConvertSymbolsToSignedInts(uint32_t *in,int in_values,int32_t *out)

{
  ulong uVar1;
  
  if (0 < in_values) {
    uVar1 = 0;
    do {
      out[uVar1] = -(in[uVar1] & 1) ^ in[uVar1] >> 1;
      uVar1 = uVar1 + 1;
    } while ((uint)in_values != uVar1);
  }
  return;
}

Assistant:

void ConvertSymbolsToSignedInts(const uint32_t *in, int in_values,
                                int32_t *out) {
  for (int i = 0; i < in_values; ++i) {
    out[i] = ConvertSymbolToSignedInt(in[i]);
  }
}